

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O3

int __thiscall
wallet::CCrypter::BytesToKeySHA512AES
          (CCrypter *this,span<const_unsigned_char,_18446744073709551615UL> salt,
          SecureString *key_data,int count,uchar *key,uchar *iv)

{
  CSHA512 *pCVar1;
  int iVar2;
  long in_FS_OFFSET;
  uchar buf [64];
  CSHA512 local_140;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if (iv != (uchar *)0x0 && (key != (uchar *)0x0 && count != 0)) {
    CSHA512::CSHA512(&local_140);
    CSHA512::Write(&local_140,(uchar *)(key_data->_M_dataplus)._M_p,key_data->_M_string_length);
    CSHA512::Write(&local_140,salt._M_ptr,salt._M_extent._M_extent_value._M_extent_value);
    CSHA512::Finalize(&local_140,(uchar *)&local_78);
    iVar2 = count + -1;
    if (iVar2 != 0) {
      do {
        pCVar1 = CSHA512::Reset(&local_140);
        pCVar1 = CSHA512::Write(pCVar1,(uchar *)&local_78,0x40);
        CSHA512::Finalize(pCVar1,(uchar *)&local_78);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    *(undefined8 *)(key + 0x10) = local_68;
    *(undefined8 *)(key + 0x18) = uStack_60;
    *(undefined8 *)key = local_78;
    *(undefined8 *)(key + 8) = uStack_70;
    *(undefined8 *)iv = local_58;
    *(undefined8 *)(iv + 8) = uStack_50;
    memory_cleanse(&local_78,0x40);
    iVar2 = 0x20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CCrypter::BytesToKeySHA512AES(const std::span<const unsigned char> salt, const SecureString& key_data, int count, unsigned char* key, unsigned char* iv) const
{
    // This mimics the behavior of openssl's EVP_BytesToKey with an aes256cbc
    // cipher and sha512 message digest. Because sha512's output size (64b) is
    // greater than the aes256 block size (16b) + aes256 key size (32b),
    // there's no need to process more than once (D_0).

    if(!count || !key || !iv)
        return 0;

    unsigned char buf[CSHA512::OUTPUT_SIZE];
    CSHA512 di;

    di.Write(UCharCast(key_data.data()), key_data.size());
    di.Write(salt.data(), salt.size());
    di.Finalize(buf);

    for(int i = 0; i != count - 1; i++)
        di.Reset().Write(buf, sizeof(buf)).Finalize(buf);

    memcpy(key, buf, WALLET_CRYPTO_KEY_SIZE);
    memcpy(iv, buf + WALLET_CRYPTO_KEY_SIZE, WALLET_CRYPTO_IV_SIZE);
    memory_cleanse(buf, sizeof(buf));
    return WALLET_CRYPTO_KEY_SIZE;
}